

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int urltype2driver(char *urltype,int *driver)

{
  int iVar1;
  int local_24;
  int ii;
  int *driver_local;
  char *urltype_local;
  
  local_24 = no_of_drivers + -1;
  while( true ) {
    if (local_24 < 0) {
      return 0x7c;
    }
    iVar1 = strcmp(driverTable[local_24].prefix,urltype);
    if (iVar1 == 0) break;
    local_24 = local_24 + -1;
  }
  *driver = local_24;
  return 0;
}

Assistant:

int urltype2driver(char *urltype, int *driver)
/*
   compare input URL with list of known drivers, returning the
   matching driver numberL.
*/

{ 
    int ii;

       /* find matching driver; search most recent drivers first */

    for (ii=no_of_drivers - 1; ii >= 0; ii--)
    {
        if (0 == strcmp(driverTable[ii].prefix, urltype))
        { 
             *driver = ii;
             return(0);
        }
    }

    return(NO_MATCHING_DRIVER);   
}